

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

bool __thiscall
gl3cts::TransformFeedback::CaptureVertexInterleaved::checkFramebuffer
          (CaptureVertexInterleaved *this,GLenum primitive_type)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 err;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  float *pfVar5;
  reference pfVar6;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_68;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_60;
  iterator i;
  allocator<float> local_41;
  undefined1 local_40 [8];
  vector<float,_std::allocator<float>_> pixels;
  Functions *gl;
  GLenum primitive_type_local;
  CaptureVertexInterleaved *this_local;
  
  pRVar4 = deqp::Context::getRenderContext(this->m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar3);
  std::allocator<float>::allocator(&local_41);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_40,4,&local_41);
  std::allocator<float>::~allocator(&local_41);
  pcVar1 = *(code **)(pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 0x488);
  pfVar5 = std::vector<float,_std::allocator<float>_>::data
                     ((vector<float,_std::allocator<float>_> *)local_40);
  (*pcVar1)(0,0,2,2,0x1903,0x1406,pfVar5);
  err = (**(code **)(pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 0x200))();
  glu::checkError(err,"glReadPixels call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xa54);
  local_60._M_current =
       (float *)std::vector<float,_std::allocator<float>_>::begin
                          ((vector<float,_std::allocator<float>_> *)local_40);
  do {
    local_68._M_current =
         (float *)std::vector<float,_std::allocator<float>_>::end
                            ((vector<float,_std::allocator<float>_> *)local_40);
    bVar2 = __gnu_cxx::operator!=(&local_60,&local_68);
    if (!bVar2) {
      this_local._7_1_ = true;
LAB_00e1aeaf:
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_40);
      return this_local._7_1_;
    }
    pfVar6 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&local_60);
    if (0.0625 < ABS(*pfVar6 - 0.5)) {
      this_local._7_1_ = false;
      goto LAB_00e1aeaf;
    }
    __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
              (&local_60);
  } while( true );
}

Assistant:

bool gl3cts::TransformFeedback::CaptureVertexInterleaved::checkFramebuffer(glw::GLenum primitive_type UNUSED)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetch framebuffer. */
	std::vector<glw::GLfloat> pixels(s_framebuffer_size * s_framebuffer_size);

	if ((s_framebuffer_size > 0) && (s_framebuffer_size > 0))
	{
		gl.readPixels(0, 0, s_framebuffer_size, s_framebuffer_size, GL_RED, GL_FLOAT, pixels.data());
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels call failed.");
	}

	/* Check results.
	 Note: assuming that s_buffer_size == 2 -> then all points shall be drawn. */
	for (std::vector<glw::GLfloat>::iterator i = pixels.begin(); i != pixels.end(); ++i)
	{
		if (fabs(*i - 0.5f) > 0.0625f /* precision */)
		{
			return false;
		}
	}

	return true;
}